

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O0

String * __thiscall
Rml::Property::ToString_abi_cxx11_(String *__return_storage_ptr__,Property *this)

{
  String local_a8;
  String local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Property *local_18;
  Property *this_local;
  String *string;
  
  local_18 = this;
  this_local = (Property *)__return_storage_ptr__;
  if (this->definition == (PropertyDefinition *)0x0) {
    ::std::__cxx11::string::string((string *)&local_58);
    Variant::Get<std::__cxx11::string>(&local_38,&this->value,&local_58);
    ::std::__cxx11::string::string((string *)&local_a8);
    ToString<Rml::Unit>(&local_88,&this->unit,&local_a8);
    ::std::operator+(__return_storage_ptr__,&local_38,&local_88);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
    PropertyDefinition::GetValue(this->definition,__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

String Property::ToString() const
{
	if (!definition)
		return value.Get<String>() + Rml::ToString(unit);

	String string;
	definition->GetValue(string, *this);
	return string;
}